

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateSizeRange(Result *__return_storage_ptr__,SizeRange *range)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  size_type *psVar10;
  char cVar11;
  ulong uVar12;
  uint __len;
  string __str;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  uint local_68;
  long local_60 [2];
  string local_50;
  
  if ((range->upperbound_ < 1) || (uVar12 = range->lowerbound_, uVar12 <= (ulong)range->upperbound_)
     ) {
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  cVar11 = '\x01';
  if (9 < uVar12) {
    uVar6 = uVar12;
    cVar3 = '\x04';
    do {
      cVar11 = cVar3;
      if (uVar6 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00302b82;
      }
      if (uVar6 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00302b82;
      }
      if (uVar6 < 10000) goto LAB_00302b82;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar11 + '\x04';
    } while (bVar1);
    cVar11 = cVar11 + '\x01';
  }
LAB_00302b82:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar12);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3db254);
  local_90 = &local_80;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_a0 = *puVar8;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar8;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar12 = range->upperbound_;
  uVar6 = -uVar12;
  if (0 < (long)uVar12) {
    uVar6 = uVar12;
  }
  __len = 1;
  if (9 < uVar6) {
    uVar9 = uVar6;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_00302cda;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_00302cda;
      }
      if (uVar9 < 10000) goto LAB_00302cda;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00302cda:
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_d0 - ((long)uVar12 >> 0x3f)),__len,uVar6);
  uVar12 = 0xf;
  if (local_b0 != &local_a0) {
    uVar12 = local_a0;
  }
  if (uVar12 < (ulong)(local_c8 + local_a8)) {
    uVar12 = 0xf;
    if (local_d0 != local_c0) {
      uVar12 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_a8) <= uVar12) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00302d69;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
LAB_00302d69:
  local_f0 = &local_e0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_e0 = *plVar4;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = *plVar4;
    local_f0 = (long *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar10 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_50.field_2._M_allocated_capacity = *psVar10;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar10;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateSizeRange(const Specification::SizeRange &range) {
        if (range.upperbound() > 0 && range.lowerbound() > static_cast<unsigned long long>(range.upperbound())) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Size range is invalid (" + std::to_string(range.lowerbound()) + ", " + std::to_string(range.upperbound()) + " ).");
        }
        return Result();
    }